

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O2

RETURN_TYPE __thiscall
duckdb::DBConfig::GetSetting<duckdb::IndexScanMaxCountSetting>
          (DBConfig *this,ClientContext *context)

{
  uint64_t uVar1;
  Value local_50;
  
  ::std::mutex::lock(&this->config_lock);
  IndexScanMaxCountSetting::GetSetting(&local_50,context);
  uVar1 = Value::GetValue<unsigned_long>(&local_50);
  Value::~Value(&local_50);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return uVar1;
}

Assistant:

typename OP::RETURN_TYPE GetSetting(const ClientContext &context) {
		std::lock_guard<mutex> lock(config_lock);
		return OP::GetSetting(context).template GetValue<typename OP::RETURN_TYPE>();
	}